

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.h
# Opt level: O0

string * absl::Substitute_abi_cxx11_(string_view format,Arg *a0,Arg *a1)

{
  string_view format_00;
  char *in_RCX;
  Arg *in_RDX;
  string *in_RDI;
  size_t in_R8;
  string *result;
  Arg *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar1;
  
  uVar1 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  format_00._M_str = in_RCX;
  format_00._M_len = in_R8;
  SubstituteAndAppend((Nonnull<std::string_*>)CONCAT17(uVar1,in_stack_ffffffffffffffd0),format_00,
                      in_stack_ffffffffffffffc8,in_RDX);
  return in_RDI;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string Substitute(
    absl::string_view format, const substitute_internal::Arg& a0,
    const substitute_internal::Arg& a1) {
  std::string result;
  SubstituteAndAppend(&result, format, a0, a1);
  return result;
}